

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CIfStm *statement)

{
  IExpression *pIVar1;
  IStatement *pIVar2;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> uVar3;
  CLabelStatement *pCVar4;
  CSeqStatement *pCVar5;
  CLabelStatement *this_00;
  CSeqStatement *pCVar6;
  CJumpStatement *this_01;
  CSeqStatement *this_02;
  ISubtreeWrapper *_wrapper;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1e0 [2];
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1d0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1c8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1c0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1b8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1b0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1a8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_1a0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_198;
  _Head_base<0UL,_const_IRT::CLabelStatement_*,_false> local_190;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_188;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_180;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_178;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_170;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperTargetPositive
  ;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperTargetNegative
  ;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperCondition;
  CLabel labelJoin;
  CLabel labelFalse;
  CLabel labelTrue;
  string local_f0 [32];
  string local_d0 [32];
  CLabel local_b0;
  CLabel local_90;
  CLabel local_70;
  CLabel local_50;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CIfStm\n");
  pIVar1 = (statement->conditionExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  wrapperCondition._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar2 = (statement->positiveStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  wrapperTargetPositive._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar2 = (statement->negativeStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  wrapperTargetNegative._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  if ((__uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>)
      wrapperTargetPositive._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>)0x0) {
    __assert_fail("wrapperTargetPositive != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                  ,0x187,"virtual void CBuildVisitor::Visit(CIfStm &)");
  }
  if ((tuple<IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>)
      wrapperTargetNegative._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl !=
      (_Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>)0x0) {
    IRT::CLabel::CLabel(&labelTrue);
    IRT::CLabel::CLabel(&labelFalse);
    IRT::CLabel::CLabel(&labelJoin);
    pCVar4 = (CLabelStatement *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_50,(string *)&labelJoin);
    IRT::CLabelStatement::CLabelStatement(pCVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pCVar5 = (CSeqStatement *)operator_new(0x18);
    this_00 = (CLabelStatement *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_70,(string *)&labelFalse);
    IRT::CLabelStatement::CLabelStatement(this_00,&local_70);
    local_1c8._M_head_impl = (CStatement *)this_00;
    pCVar6 = (CSeqStatement *)operator_new(0x18);
    (**(code **)(*(long *)wrapperTargetNegative._M_t.
                          super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                          .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 8))
              (local_1e0);
    local_178._M_head_impl = local_1e0[0]._M_head_impl;
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    local_180._M_head_impl = (CStatement *)pCVar4;
    IRT::CSeqStatement::CSeqStatement
              (pCVar6,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_178,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_180);
    local_170._M_head_impl = (CStatement *)pCVar6;
    IRT::CSeqStatement::CSeqStatement
              (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_1c8,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_170);
    if ((CSeqStatement *)local_170._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_170._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_170._M_head_impl = (CStatement *)0x0;
    if ((CLabelStatement *)local_180._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_180._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_180._M_head_impl = (CStatement *)0x0;
    if (local_178._M_head_impl != (CStatement *)0x0) {
      (*((local_178._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_178._M_head_impl = (CStatement *)0x0;
    if (local_1e0[0]._M_head_impl != (CStatement *)0x0) {
      (*((local_1e0[0]._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_1c8._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_1c8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1c8._M_head_impl = (CStatement *)0x0;
    std::__cxx11::string::~string((string *)&local_70);
    pCVar6 = (CSeqStatement *)operator_new(0x18);
    this_01 = (CJumpStatement *)operator_new(0x10);
    pCVar4 = (CLabelStatement *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_90,(string *)&labelJoin);
    IRT::CLabelStatement::CLabelStatement(pCVar4,&local_90);
    local_190._M_head_impl = pCVar4;
    IRT::CJumpStatement::CJumpStatement
              (this_01,(unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
                        *)&local_190);
    local_198._M_head_impl = (CStatement *)pCVar5;
    local_188._M_head_impl = (CStatement *)this_01;
    IRT::CSeqStatement::CSeqStatement
              (pCVar6,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_188,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_198);
    if ((CSeqStatement *)local_198._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_198._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_198._M_head_impl = (CStatement *)0x0;
    if ((CJumpStatement *)local_188._M_head_impl != (CJumpStatement *)0x0) {
      (*((INode *)&((local_188._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_188._M_head_impl = (CStatement *)0x0;
    if (local_190._M_head_impl != (CLabelStatement *)0x0) {
      (*((local_190._M_head_impl)->super_CStatement).super_IStatement.super_INode._vptr_INode[2])();
    }
    local_190._M_head_impl = (CLabelStatement *)0x0;
    std::__cxx11::string::~string((string *)&local_90);
    pCVar5 = (CSeqStatement *)operator_new(0x18);
    pCVar4 = (CLabelStatement *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_b0,(string *)&labelTrue);
    IRT::CLabelStatement::CLabelStatement(pCVar4,&local_b0);
    local_1d0._M_head_impl = (CStatement *)pCVar4;
    this_02 = (CSeqStatement *)operator_new(0x18);
    (**(code **)(*(long *)wrapperTargetPositive._M_t.
                          super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                          .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 8))
              (local_1e0);
    local_1a8._M_head_impl = local_1e0[0]._M_head_impl;
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    local_1b0._M_head_impl = (CStatement *)pCVar6;
    IRT::CSeqStatement::CSeqStatement
              (this_02,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_1a8,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_1b0);
    local_1a0._M_head_impl = (CStatement *)this_02;
    IRT::CSeqStatement::CSeqStatement
              (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_1d0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_1a0);
    if ((CSeqStatement *)local_1a0._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_1a0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1a0._M_head_impl = (CStatement *)0x0;
    if ((CSeqStatement *)local_1b0._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_1b0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1b0._M_head_impl = (CStatement *)0x0;
    if (local_1a8._M_head_impl != (CStatement *)0x0) {
      (*((local_1a8._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_1a8._M_head_impl = (CStatement *)0x0;
    if (local_1e0[0]._M_head_impl != (CStatement *)0x0) {
      (*((local_1e0[0]._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_1d0._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_1d0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1d0._M_head_impl = (CStatement *)0x0;
    std::__cxx11::string::~string((string *)&local_b0);
    _wrapper = (ISubtreeWrapper *)operator_new(0x10);
    pCVar6 = (CSeqStatement *)operator_new(0x18);
    uVar3 = wrapperCondition;
    std::__cxx11::string::string(local_d0,(string *)&labelTrue);
    std::__cxx11::string::string(local_f0,(string *)&labelFalse);
    (**(code **)(*(long *)uVar3._M_t.
                          super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                          .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 0x10)
    )(local_1e0,
      uVar3._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl,local_d0,local_f0);
    local_1b8._M_head_impl = local_1e0[0]._M_head_impl;
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    local_1c0._M_head_impl = (CStatement *)pCVar5;
    IRT::CSeqStatement::CSeqStatement
              (pCVar6,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_1b8,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_1c0);
    _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b4c8;
    _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar6;
    updateSubtreeWrapper(this,_wrapper);
    if ((CSeqStatement *)local_1c0._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_1c0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_1c0._M_head_impl = (CStatement *)0x0;
    if (local_1b8._M_head_impl != (CStatement *)0x0) {
      (*((local_1b8._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_1b8._M_head_impl = (CStatement *)0x0;
    if (local_1e0[0]._M_head_impl != (CStatement *)0x0) {
      (*((local_1e0[0]._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_1e0[0]._M_head_impl = (CStatement *)0x0;
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&labelJoin);
    std::__cxx11::string::~string((string *)&labelFalse);
    std::__cxx11::string::~string((string *)&labelTrue);
    std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
              (&wrapperTargetNegative);
    std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
              (&wrapperTargetPositive);
    std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
              (&wrapperCondition);
    return;
  }
  __assert_fail("wrapperTargetNegative != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                ,0x188,"virtual void CBuildVisitor::Visit(CIfStm &)");
}

Assistant:

void CBuildVisitor::Visit( CIfStm &statement ) {
    std::cout << "IRT builder: CIfStm\n";
    statement.conditionExpression->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperCondition = std::move( wrapper );
    statement.positiveStatement->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperTargetPositive = std::move( wrapper );
    statement.negativeStatement->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperTargetNegative = std::move( wrapper );

    assert( wrapperTargetPositive != nullptr );
    assert( wrapperTargetNegative != nullptr );

    IRT::CLabel labelTrue;
    IRT::CLabel labelFalse;
    IRT::CLabel labelJoin;

    std::unique_ptr<const IRT::CStatement> suffix( new IRT::CLabelStatement( labelJoin ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CLabelStatement( labelFalse ))),
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                            std::move( wrapperTargetNegative->ToStatement( )),
                            std::move( suffix )
                    )))
            )
    ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>(
                            new IRT::CJumpStatement( std::move( std::unique_ptr<const IRT::CLabelStatement>(
                                    new IRT::CLabelStatement(
                                            labelJoin
                                    )
                            )))
                    )),
                    std::move( suffix )
            )
    ));

    suffix = std::move( std::unique_ptr<const IRT::CStatement>(
            new IRT::CSeqStatement(
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CLabelStatement( labelTrue ))),
                    std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                            std::move( wrapperTargetPositive->ToStatement( )),
                            std::move( suffix )
                    )))
            )
    ));

    updateSubtreeWrapper( new IRT::CStatementWrapper(
            new IRT::CSeqStatement(
                    std::move( wrapperCondition->ToConditional( labelTrue, labelFalse )),
                    std::move( suffix )
            )
    ));
}